

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O1

bool __thiscall boost::thread::start_thread_noexcept(thread *this,attributes *attr)

{
  element_type *peVar1;
  int iVar2;
  bool bVar3;
  int detached_state;
  thread_data_ptr local_thread_info;
  int local_2c;
  element_type *local_28;
  shared_count sStack_20;
  
  peVar1 = (this->thread_info).px;
  if (peVar1 != (element_type *)0x0) {
    shared_ptr<boost::detail::thread_data_base>::operator=(&peVar1->self,&this->thread_info);
    peVar1 = (this->thread_info).px;
    if (peVar1 != (element_type *)0x0) {
      iVar2 = pthread_create(&peVar1->thread_handle,(pthread_attr_t *)attr,
                             (anonymous_namespace)::thread_proxy,peVar1);
      if (iVar2 == 0) {
        iVar2 = pthread_attr_getdetachstate((pthread_attr_t *)attr,&local_2c);
        bVar3 = iVar2 == 0;
        if (bVar3) {
          if (local_2c != 1) {
            return bVar3;
          }
          local_28 = (this->thread_info).px;
          (this->thread_info).px = (element_type *)0x0;
          sStack_20.pi_ = (this->thread_info).pn.pi_;
          (this->thread_info).pn.pi_ = (sp_counted_base *)0x0;
          if ((local_28 != (element_type *)0x0) && (local_28->join_started == false)) {
            local_28->join_started = true;
            local_28->joined = true;
          }
        }
        else {
          peVar1 = (this->thread_info).px;
          if (peVar1 == (element_type *)0x0) goto LAB_0019c161;
          local_28 = (peVar1->self).px;
          sStack_20.pi_ = (peVar1->self).pn.pi_;
          (peVar1->self).px = (element_type *)0x0;
          (peVar1->self).pn.pi_ = (sp_counted_base *)0x0;
        }
        detail::shared_count::~shared_count(&sStack_20);
      }
      else {
        peVar1 = (this->thread_info).px;
        if (peVar1 == (element_type *)0x0) goto LAB_0019c161;
        local_28 = (peVar1->self).px;
        sStack_20.pi_ = (peVar1->self).pn.pi_;
        (peVar1->self).px = (element_type *)0x0;
        (peVar1->self).pn.pi_ = (sp_counted_base *)0x0;
        detail::shared_count::~shared_count(&sStack_20);
        bVar3 = false;
      }
      return bVar3;
    }
  }
LAB_0019c161:
  __assert_fail("px != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                ,0x2de,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::detail::thread_data_base>::operator->() const [T = boost::detail::thread_data_base]"
               );
}

Assistant:

bool thread::start_thread_noexcept(const attributes& attr)
    {
        thread_info->self=thread_info;
        const attributes::native_handle_type* h = attr.native_handle();
        int res = pthread_create(&thread_info->thread_handle, h, &thread_proxy, thread_info.get());
        if (res != 0)
        {
            thread_info->self.reset();
            return false;
        }
        int detached_state;
        res = pthread_attr_getdetachstate(h, &detached_state);
        if (res != 0)
        {
            thread_info->self.reset();
            return false;
        }
        if (PTHREAD_CREATE_DETACHED==detached_state)
        {
          detail::thread_data_ptr local_thread_info;
          thread_info.swap(local_thread_info);

          if(local_thread_info)
          {
              //lock_guard<mutex> lock(local_thread_info->data_mutex);
              if(!local_thread_info->join_started)
              {
                  //BOOST_VERIFY(!pthread_detach(local_thread_info->thread_handle));
                  local_thread_info->join_started=true;
                  local_thread_info->joined=true;
              }
          }
        }
        return true;
    }